

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTestCase.cpp
# Opt level: O2

void __thiscall SuiteDictionaryTests::TestsetGetDouble::TestsetGetDouble(TestsetGetDouble *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"setGetDouble","DictionaryTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DictionaryTestCase.cpp"
             ,0x58);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031c690;
  return;
}

Assistant:

TEST(setGetDouble)
{
  Dictionary object;
  object.setDouble( "DOUBLEKEY1", 12.3 );
  object.setDouble( "DOUBLEKEY2", 9827362.9827362 );
  object.setString( "BADDOUBLEKEY", "AB12.3" );

  CHECK_EQUAL( 12.3, object.getDouble( "DOUBLEKEY1" ) );
  CHECK_EQUAL( 9827362.9827362, object.getDouble( "DOUBLEKEY2" ) );
  CHECK_THROW( object.getDouble( "DOUBLEKEY3" ), ConfigError );
  CHECK_THROW( object.getDouble( "BADDOUBLEKEY" ), ConfigError );
}